

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

Index __thiscall
wabt::interp::FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>
          (FreeList<wabt::interp::Ref> *this,Ref *args)

{
  pointer puVar1;
  _Bit_type *p_Var2;
  ulong uVar3;
  iterator __position;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  puVar1 = (this->free_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->free_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == puVar1) {
    if ((long)(this->list_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->list_).
              super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 !=
        (ulong)(this->is_free_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
        ((long)(this->is_free_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
        (long)(this->is_free_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) {
      __assert_fail("list_.size() == is_free_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-inl.h"
                    ,0x98,
                    "Index wabt::interp::FreeList<wabt::interp::Ref>::New(Args &&...) [T = wabt::interp::Ref, Args = <wabt::interp::Ref &>]"
                   );
    }
    std::vector<bool,_std::allocator<bool>_>::push_back(&this->is_free_,false);
    __position._M_current =
         (this->list_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->list_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>>::
      _M_realloc_insert<wabt::interp::Ref&>
                ((vector<wabt::interp::Ref,std::allocator<wabt::interp::Ref>> *)this,__position,args
                );
    }
    else {
      (__position._M_current)->index = args->index;
      (this->list_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    uVar4 = ((long)(this->list_).
                   super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(this->list_).
                   super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3) - 1;
  }
  else {
    uVar4 = puVar1[-1];
    uVar5 = uVar4 + 0x3f;
    if (-1 < (long)uVar4) {
      uVar5 = uVar4;
    }
    p_Var2 = (this->is_free_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar6 = (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001);
    uVar3 = p_Var2[((long)uVar5 >> 6) + uVar6 + 0xffffffffffffffff];
    if ((uVar3 >> (uVar4 & 0x3f) & 1) == 0) {
      __assert_fail("is_free_[index]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp-inl.h"
                    ,0x92,
                    "Index wabt::interp::FreeList<wabt::interp::Ref>::New(Args &&...) [T = wabt::interp::Ref, Args = <wabt::interp::Ref &>]"
                   );
    }
    (this->free_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1 + -1;
    p_Var2[((long)uVar5 >> 6) + uVar6 + 0xffffffffffffffff] = uVar3 & ~(1L << ((byte)uVar4 & 0x3f));
    (this->list_).super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4].index = args->index;
  }
  return uVar4;
}

Assistant:

auto FreeList<T>::New(Args&&... args) -> Index {
  if (!free_.empty()) {
    Index index = free_.back();
    assert(is_free_[index]);
    free_.pop_back();
    is_free_[index] = false;
    list_[index] = T(std::forward<Args>(args)...);
    return index;
  }
  assert(list_.size() == is_free_.size());
  is_free_.push_back(false);
  list_.emplace_back(std::forward<Args>(args)...);
  return list_.size() - 1;
}